

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void cs_hmac_sha1(uchar *key,size_t keylen,uchar *data,size_t datalen,uchar *out)

{
  long lVar1;
  uchar buf2 [64];
  uchar buf1 [64];
  uchar tmp_key [20];
  uint local_138 [32];
  uchar local_b8 [32];
  cs_sha1_ctx local_98;
  
  if (0x40 < keylen) {
    local_98.state[0] = 0x67452301;
    local_98.state[1] = 0xefcdab89;
    local_98.state[2] = 0x98badcfe;
    local_98.state[3] = 0x10325476;
    local_98.state[4] = 0xc3d2e1f0;
    local_98.count[0] = 0;
    local_98.count[1] = 0;
    cs_sha1_update(&local_98,key,(uint32_t)keylen);
    key = local_b8;
    cs_sha1_final(key,&local_98);
    keylen = 0x14;
  }
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  memcpy(local_138 + 0x10,key,keylen);
  memcpy(local_138,key,keylen);
  lVar1 = 0;
  do {
    *(uint *)((long)local_138 + lVar1 + 0x40) =
         *(uint *)((long)local_138 + lVar1 + 0x40) ^ 0x36363636;
    *(uint *)((long)local_138 + lVar1 + 0x44) =
         *(uint *)((long)local_138 + lVar1 + 0x44) ^ 0x36363636;
    *(uint *)((long)local_138 + lVar1 + 0x48) =
         *(uint *)((long)local_138 + lVar1 + 0x48) ^ 0x36363636;
    *(uint *)((long)local_138 + lVar1 + 0x4c) =
         *(uint *)((long)local_138 + lVar1 + 0x4c) ^ 0x36363636;
    *(uint *)((long)local_138 + lVar1) = *(uint *)((long)local_138 + lVar1) ^ 0x5c5c5c5c;
    *(uint *)((long)local_138 + lVar1 + 4) = *(uint *)((long)local_138 + lVar1 + 4) ^ 0x5c5c5c5c;
    *(uint *)((long)local_138 + lVar1 + 8) = *(uint *)((long)local_138 + lVar1 + 8) ^ 0x5c5c5c5c;
    *(uint *)((long)local_138 + lVar1 + 0xc) = *(uint *)((long)local_138 + lVar1 + 0xc) ^ 0x5c5c5c5c
    ;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  local_98.state[0] = 0x67452301;
  local_98.state[1] = 0xefcdab89;
  local_98.state[2] = 0x98badcfe;
  local_98.state[3] = 0x10325476;
  local_98.state[4] = 0xc3d2e1f0;
  local_98.count[0] = 0;
  local_98.count[1] = 0;
  cs_sha1_update(&local_98,(uchar *)(local_138 + 0x10),0x40);
  cs_sha1_update(&local_98,data,(uint32_t)datalen);
  cs_sha1_final(out,&local_98);
  local_98.state[0] = 0x67452301;
  local_98.state[1] = 0xefcdab89;
  local_98.state[2] = 0x98badcfe;
  local_98.state[3] = 0x10325476;
  local_98.state[4] = 0xc3d2e1f0;
  local_98.count[0] = 0;
  local_98.count[1] = 0;
  cs_sha1_update(&local_98,(uchar *)local_138,0x40);
  cs_sha1_update(&local_98,out,0x14);
  cs_sha1_final(out,&local_98);
  return;
}

Assistant:

void cs_hmac_sha1(const unsigned char *key, size_t keylen,
                  const unsigned char *data, size_t datalen,
                  unsigned char out[20]) {
    cs_sha1_ctx ctx;
    unsigned char buf1[64], buf2[64], tmp_key[20], i;

    if (keylen > sizeof(buf1)) {
        cs_sha1_init(&ctx);
        cs_sha1_update(&ctx, key, keylen);
        cs_sha1_final(tmp_key, &ctx);
        key = tmp_key;
        keylen = sizeof(tmp_key);
    }

    memset(buf1, 0, sizeof(buf1));
    memset(buf2, 0, sizeof(buf2));
    memcpy(buf1, key, keylen);
    memcpy(buf2, key, keylen);

    for (i = 0; i < sizeof(buf1); i++) {
        buf1[i] ^= 0x36;
        buf2[i] ^= 0x5c;
    }

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf1, sizeof(buf1));
    cs_sha1_update(&ctx, data, datalen);
    cs_sha1_final(out, &ctx);

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf2, sizeof(buf2));
    cs_sha1_update(&ctx, out, 20);
    cs_sha1_final(out, &ctx);
}